

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# master.cpp
# Opt level: O3

RpcValue __thiscall
miniros::master::Master::searchParam(Master *this,string *caller_id,string *key,Connection *param_3)

{
  XmlRpcValue *pXVar1;
  anon_union_8_8_d5adaace_for__value extraout_RDX;
  anon_union_8_8_d5adaace_for__value extraout_RDX_00;
  anon_union_8_8_d5adaace_for__value aVar2;
  char *rhs;
  RpcValue RVar3;
  string foundKey;
  XmlRpcValue local_50;
  string local_40;
  
  XmlRpc::XmlRpcValue::Array((XmlRpcValue *)this,3);
  ParameterStorage::searchParam
            (&local_40,(ParameterStorage *)(caller_id + 0x1d),key,(string *)param_3);
  if (local_40._M_string_length == 0) {
    local_50._type = TypeInvalid;
    pXVar1 = XmlRpc::XmlRpcValue::operator[]((XmlRpcValue *)this,0);
    XmlRpc::XmlRpcValue::operator=(pXVar1,(int *)&local_50);
    pXVar1 = XmlRpc::XmlRpcValue::operator[]((XmlRpcValue *)this,1);
    rhs = "searchParam param not found";
  }
  else {
    local_50._type = TypeBoolean;
    pXVar1 = XmlRpc::XmlRpcValue::operator[]((XmlRpcValue *)this,0);
    XmlRpc::XmlRpcValue::operator=(pXVar1,(int *)&local_50);
    pXVar1 = XmlRpc::XmlRpcValue::operator[]((XmlRpcValue *)this,1);
    rhs = "searchParam success";
  }
  XmlRpc::XmlRpcValue::operator=(pXVar1,rhs);
  XmlRpc::XmlRpcValue::XmlRpcValue(&local_50,&local_40);
  pXVar1 = XmlRpc::XmlRpcValue::operator[]((XmlRpcValue *)this,2);
  XmlRpc::XmlRpcValue::operator=(pXVar1,&local_50);
  XmlRpc::XmlRpcValue::invalidate(&local_50);
  aVar2 = extraout_RDX;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    aVar2 = extraout_RDX_00;
  }
  RVar3._value.asDouble = aVar2.asDouble;
  RVar3._0_8_ = this;
  return RVar3;
}

Assistant:

Master::RpcValue Master::searchParam(const std::string& caller_id, const std::string& key, Connection*)
{
  RpcValue res = RpcValue::Array(3);
  std::string foundKey = m_parameterStorage.searchParam(caller_id, key);
  if (!foundKey.empty()) {
    res[0] = 1;
    res[1] = "searchParam success";
  } else {
    res[0] = 0;
    res[1] = "searchParam param not found";
  }
  res[2] = foundKey;
  return res;
}